

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O1

void __thiscall libtorrent::aux::peer_connection::update_desired_queue_size(peer_connection *this)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  session_settings *psVar5;
  int iVar6;
  undefined4 extraout_var;
  element_type *peVar7;
  int iVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar9;
  unique_lock<std::mutex> local_38;
  
  if (((this->super_peer_connection_hot_members).field_0x28 & 8) == 0) {
    uVar1 = this->m_desired_queue_size;
    iVar6 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0xe])(this);
    uVar3 = *(uint *)(CONCAT44(extraout_var,iVar6) + 0x2c);
    psVar5 = (this->super_peer_connection_hot_members).m_settings;
    local_38._M_device = &psVar5->m_mutex;
    local_38._M_owns = false;
    ::std::unique_lock<std::mutex>::lock(&local_38);
    local_38._M_owns = true;
    uVar4 = (psVar5->m_store).m_ints._M_elems[6];
    ::std::unique_lock<std::mutex>::~unique_lock(&local_38);
    if ((this->field_0x887 & 0x20) == 0) {
      this_00 = (this->super_peer_connection_hot_members).m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar6 = this_00->_M_use_count;
        do {
          if (iVar6 == 0) {
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            break;
          }
          LOCK();
          iVar8 = this_00->_M_use_count;
          bVar9 = iVar6 == iVar8;
          if (bVar9) {
            this_00->_M_use_count = iVar6 + 1;
            iVar8 = iVar6;
          }
          iVar6 = iVar8;
          UNLOCK();
        } while (!bVar9);
      }
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar9 = true;
      }
      else {
        bVar9 = this_00->_M_use_count == 0;
      }
      if (bVar9) {
        peVar7 = (element_type *)0x0;
      }
      else {
        peVar7 = (this->super_peer_connection_hot_members).m_torrent.
                 super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      iVar6 = (((peVar7->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_files).m_piece_length;
      iVar8 = 0x4000;
      if (iVar6 < 0x4000) {
        iVar8 = iVar6;
      }
      if (iVar6 < 1) {
        iVar8 = 0x4000;
      }
      this->m_desired_queue_size = (uint16_t)((int)(uVar4 * uVar3) / iVar8);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    uVar2 = this->m_max_out_request_queue;
    if (uVar2 < this->m_desired_queue_size) {
      this->m_desired_queue_size = uVar2;
    }
    if (this->m_desired_queue_size < 2) {
      this->m_desired_queue_size = 2;
    }
    if (uVar1 != this->m_desired_queue_size) {
      peer_log(this,info,"UPDATE_QUEUE_SIZE",
               "dqs: %d max: %d dl: %d qt: %d snubbed: %d slow-start: %d",
               (ulong)this->m_desired_queue_size,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
               (ulong)(*(uint *)&(this->super_peer_connection_hot_members).field_0x28 >> 3 & 1),
               (ulong)((byte)this->field_0x887 >> 5 & 1));
    }
  }
  else {
    this->m_desired_queue_size = 1;
  }
  return;
}

Assistant:

void peer_connection::update_desired_queue_size()
	{
		TORRENT_ASSERT(is_single_thread());
		if (m_snubbed)
		{
			m_desired_queue_size = 1;
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		int const previous_queue_size = m_desired_queue_size;
#endif

		int const download_rate = statistics().download_payload_rate();

		// the desired download queue size
		int const queue_time = m_settings.get_int(settings_pack::request_queue_time);

		// when we're in slow-start mode we increase the desired queue size every
		// time we receive a piece, no need to adjust it here (other than
		// enforcing the upper limit)
		if (!m_slow_start)
		{
			// (if the latency is more than this, the download will stall)
			// so, the queue size is queue_time * down_rate / 16 kiB
			// (16 kB is the size of each request)
			// the minimum number of requests is 2 and the maximum is 48
			// the block size doesn't have to be 16. So we first query the
			// torrent for it
			auto t = m_torrent.lock();
			int const bs = t->block_size();

			TORRENT_ASSERT(bs > 0);

			m_desired_queue_size = std::uint16_t(queue_time * download_rate / bs);
		}

		if (m_desired_queue_size > m_max_out_request_queue)
			m_desired_queue_size = m_max_out_request_queue;
		if (m_desired_queue_size < min_request_queue)
			m_desired_queue_size = min_request_queue;

#ifndef TORRENT_DISABLE_LOGGING
		if (previous_queue_size != m_desired_queue_size)
		{
			peer_log(peer_log_alert::info, "UPDATE_QUEUE_SIZE"
				, "dqs: %d max: %d dl: %d qt: %d snubbed: %d slow-start: %d"
				, int(m_desired_queue_size), int(m_max_out_request_queue)
				, download_rate, queue_time, int(m_snubbed), int(m_slow_start));
		}
#endif
	}